

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O0

bool cppcms::sessions::impl::hmac_cipher::equal(void *a,void *b,size_t n)

{
  size_t i;
  size_t diff;
  char *right;
  char *left;
  size_t n_local;
  void *b_local;
  void *a_local;
  
  diff = 0;
  for (i = 0; i < n; i = i + 1) {
    if (*(char *)((long)a + i) != *(char *)((long)b + i)) {
      diff = diff + 1;
    }
  }
  return diff == 0;
}

Assistant:

bool hmac_cipher::equal(void const *a,void const *b,size_t n)
{
	char const *left = static_cast<char const *>(a);
	char const *right = static_cast<char const *>(b);
	size_t diff = 0;
	for(size_t i=0;i<n;i++) {
		if(left[i]!=right[i])
			diff++;
	}
	return diff==0;
}